

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

uchar * duckdb_shell_sqlite3_value_text(sqlite3_value *pVal)

{
  string_t input;
  undefined1 uVar1;
  byte bVar2;
  sqlite3_value *psVar3;
  long in_RDI;
  string *str_val;
  Value value;
  undefined6 in_stack_ffffffffffffff30;
  string *in_stack_ffffffffffffff38;
  string_t *in_stack_ffffffffffffff40;
  LogicalTypeId in_stack_ffffffffffffff4f;
  LogicalType *in_stack_ffffffffffffff50;
  double in_stack_ffffffffffffff68;
  Value *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Value *in_stack_ffffffffffffff90;
  undefined8 local_8;
  
  uVar1 = (undefined1)((ulong)in_stack_ffffffffffffff80 >> 0x38);
  if (in_RDI == 0) {
    local_8 = (uchar *)0x0;
  }
  else if ((*(char *)(in_RDI + 8) == '\x03') || (*(char *)(in_RDI + 8) == '\x04')) {
    local_8 = (uchar *)std::__cxx11::string::c_str();
  }
  else if ((*(char *)(in_RDI + 8) == '\x01') || (*(char *)(in_RDI + 8) == '\x02')) {
    if (*(char *)(in_RDI + 8) == '\x01') {
      duckdb::Value::BIGINT((int64_t)in_stack_ffffffffffffff68);
    }
    else {
      duckdb::Value::DOUBLE(in_stack_ffffffffffffff68);
    }
    duckdb::LogicalType::LogicalType(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4f);
    uVar1 = duckdb::Value::DefaultTryCastAs
                      (in_stack_ffffffffffffff90,
                       (LogicalType *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       (bool)uVar1);
    bVar2 = uVar1 ^ 0xff;
    duckdb::LogicalType::~LogicalType((LogicalType *)0x20f2a5);
    if ((bVar2 & 1) == 0) {
      psVar3 = (sqlite3_value *)duckdb::StringValue::Get_abi_cxx11_(in_stack_ffffffffffffff70);
      duckdb::string_t::string_t(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      input.value.pointer.ptr = (char *)in_stack_ffffffffffffff78;
      input.value._0_8_ = in_stack_ffffffffffffff70;
      duckdb::CastToSQLiteValue::Operation<duckdb::string_t>(input);
      sqlite3_value::operator=
                ((sqlite3_value *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff30)),psVar3);
      sqlite3_value::~sqlite3_value((sqlite3_value *)0x20f36d);
      local_8 = (uchar *)std::__cxx11::string::c_str();
    }
    else {
      *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xa0) = 7;
      local_8 = (uchar *)0x0;
    }
    duckdb::Value::~Value((Value *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff30)));
  }
  else if (*(char *)(in_RDI + 8) == '\x05') {
    local_8 = (uchar *)0x0;
  }
  else {
    *(undefined4 *)(*(long *)(in_RDI + 0x30) + 0xa0) = 0x14;
    local_8 = (uchar *)0x0;
  }
  return local_8;
}

Assistant:

const unsigned char *sqlite3_value_text(sqlite3_value *pVal) {
	if (!pVal) {
		return nullptr;
	}
	if (pVal->type == SQLiteTypeValue::TEXT || pVal->type == SQLiteTypeValue::BLOB) {
		return (const unsigned char *)pVal->str.c_str();
	}

	if (pVal->type == SQLiteTypeValue::INTEGER || pVal->type == SQLiteTypeValue::FLOAT) {
		Value value = (pVal->type == SQLiteTypeValue::INTEGER) ? Value::BIGINT(pVal->u.i) : Value::DOUBLE(pVal->u.r);
		if (!value.DefaultTryCastAs(LogicalType::VARCHAR)) {
			pVal->db->errCode = SQLITE_NOMEM;
			return nullptr;
		}
		auto &str_val = StringValue::Get(value);
		*pVal = CastToSQLiteValue::Operation<string_t>(string_t(str_val));
		return (const unsigned char *)pVal->str.c_str();
	}
	if (pVal->type == SQLiteTypeValue::NULL_VALUE) {
		return nullptr;
	}
	pVal->db->errCode = SQLITE_MISMATCH;
	return nullptr;
}